

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::textChanged(QLineEditPrivate *this,QString *text)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QString *in_RSI;
  QLineEditPrivate *in_RDI;
  bool display;
  int newTextSize;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  
  bVar1 = hasSideWidgets(in_RDI);
  if (bVar1) {
    qVar3 = QString::size(in_RSI);
    iVar2 = (int)qVar3;
    if ((iVar2 == 0) || (in_RDI->lastTextSize == 0)) {
      in_RDI->lastTextSize = iVar2;
      uVar4 = CONCAT13(0 < iVar2,(int3)in_stack_ffffffffffffffe8);
      displayWidgets((SideWidgetEntryList *)CONCAT44(iVar2,uVar4),SUB81((ulong)in_RDI >> 0x38,0));
      displayWidgets((SideWidgetEntryList *)CONCAT44(iVar2,uVar4),SUB81((ulong)in_RDI >> 0x38,0));
    }
  }
  return;
}

Assistant:

void QLineEditPrivate::textChanged(const QString &text)
{
    if (hasSideWidgets()) {
        const int newTextSize = text.size();
        if (!newTextSize || !lastTextSize) {
            lastTextSize = newTextSize;
#if QT_CONFIG(animation) && QT_CONFIG(toolbutton)
            const bool display = newTextSize > 0;
            displayWidgets(leadingSideWidgets, display);
            displayWidgets(trailingSideWidgets, display);
#endif
        }
    }
}